

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O0

void __thiscall Ptex::v2_4::PtexReaderCache::purge(PtexReaderCache *this,PtexTexture *texture)

{
  PtexReaderCache *in_RSI;
  PtexCachedReader *reader;
  PtexReaderCache *this_00;
  
  this_00 = in_RSI;
  PtexCachedReader::unref((PtexCachedReader *)in_RSI);
  purge(this_00,(PtexCachedReader *)in_RSI);
  PtexCachedReader::ref((PtexCachedReader *)in_RSI);
  return;
}

Assistant:

void PtexReaderCache::purge(PtexTexture* texture)
{
    PtexCachedReader* reader = static_cast<PtexCachedReader*>(texture);
    reader->unref();
    purge(reader);
    reader->ref();
}